

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O2

void lys_type_free(ly_ctx *ctx,lys_type *type)

{
  lys_type_bit *plVar1;
  lys_node_leaf *__ptr;
  long lVar2;
  long lVar3;
  
  if (ctx == (ly_ctx *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
                  ,0x788,"void lys_type_free(struct ly_ctx *, struct lys_type *)");
  }
  if (type == (lys_type *)0x0) {
switchD_001515d3_caseD_3:
    return;
  }
  lydict_remove(ctx,type->module_name);
  lys_extension_instances_free(ctx,type->ext,(uint)type->ext_size);
  switch(type->base) {
  case LY_TYPE_BINARY:
  case LY_TYPE_DEC64:
  case LY_TYPE_INT8:
  case LY_TYPE_UINT8:
  case LY_TYPE_INT16:
  case LY_TYPE_UINT16:
  case LY_TYPE_INT32:
  case LY_TYPE_UINT32:
  case LY_TYPE_INT64:
  case LY_TYPE_UINT64:
    lys_restr_free(ctx,(type->info).dec64.range);
  case LY_TYPE_IDENT:
    __ptr = (lys_node_leaf *)(type->info).bits.bit;
    break;
  case LY_TYPE_BITS:
    lVar3 = 0;
    for (lVar2 = 0; __ptr = (lys_node_leaf *)(type->info).bits.bit, lVar2 < (type->info).bits.count;
        lVar2 = lVar2 + 1) {
      lydict_remove(ctx,*(char **)((long)__ptr->padding + lVar3 + -0x1c));
      lydict_remove(ctx,*(char **)((long)&((type->info).bits.bit)->dsc + lVar3));
      lydict_remove(ctx,*(char **)((long)&((type->info).bits.bit)->ref + lVar3));
      plVar1 = (type->info).bits.bit;
      lys_iffeature_free(ctx,*(lys_iffeature **)((long)&plVar1->iffeature + lVar3),
                         (&plVar1->iffeature_size)[lVar3]);
      plVar1 = (type->info).bits.bit;
      lys_extension_instances_free
                (ctx,*(lys_ext_instance ***)((long)&plVar1->ext + lVar3),
                 (uint)(&plVar1->ext_size)[lVar3]);
      lVar3 = lVar3 + 0x30;
    }
    break;
  default:
    goto switchD_001515d3_caseD_3;
  case LY_TYPE_ENUM:
    lVar3 = 0;
    for (lVar2 = 0; __ptr = (lys_node_leaf *)(type->info).bits.bit, lVar2 < (type->info).bits.count;
        lVar2 = lVar2 + 1) {
      lydict_remove(ctx,*(char **)((long)__ptr->padding + lVar3 + -0x1c));
      lydict_remove(ctx,*(char **)((long)&((type->info).bits.bit)->dsc + lVar3));
      lydict_remove(ctx,*(char **)((long)&((type->info).bits.bit)->ref + lVar3));
      plVar1 = (type->info).bits.bit;
      lys_iffeature_free(ctx,*(lys_iffeature **)((long)&plVar1->iffeature + lVar3),
                         (&plVar1->iffeature_size)[lVar3]);
      plVar1 = (type->info).bits.bit;
      lys_extension_instances_free
                (ctx,*(lys_ext_instance ***)((long)&plVar1->ext + lVar3),
                 (uint)(&plVar1->ext_size)[lVar3]);
      lVar3 = lVar3 + 0x30;
    }
    break;
  case LY_TYPE_LEAFREF:
    lydict_remove(ctx,(type->info).lref.path);
    return;
  case LY_TYPE_STRING:
    lys_restr_free(ctx,(type->info).dec64.range);
    free((type->info).bits.bit);
    lVar3 = 0;
    for (lVar2 = 0; __ptr = (type->info).lref.target, lVar2 < (type->info).str.pat_count;
        lVar2 = lVar2 + 1) {
      lys_restr_free(ctx,(lys_restr *)((long)__ptr->padding + lVar3 + -0x1c));
      lVar3 = lVar3 + 0x38;
    }
    break;
  case LY_TYPE_UNION:
    lVar3 = 0;
    for (lVar2 = 0; __ptr = (lys_node_leaf *)(type->info).bits.bit, lVar2 < (type->info).bits.count;
        lVar2 = lVar2 + 1) {
      lys_type_free(ctx,(lys_type *)((long)__ptr->padding + lVar3 + -0x1c));
      lVar3 = lVar3 + 0x40;
    }
  }
  free(__ptr);
  return;
}

Assistant:

void
lys_type_free(struct ly_ctx *ctx, struct lys_type *type)
{
    int i;

    assert(ctx);
    if (!type) {
        return;
    }

    lydict_remove(ctx, type->module_name);

    lys_extension_instances_free(ctx, type->ext, type->ext_size);

    switch (type->base) {
    case LY_TYPE_BINARY:
        lys_restr_free(ctx, type->info.binary.length);
        free(type->info.binary.length);
        break;
    case LY_TYPE_BITS:
        for (i = 0; i < type->info.bits.count; i++) {
            lydict_remove(ctx, type->info.bits.bit[i].name);
            lydict_remove(ctx, type->info.bits.bit[i].dsc);
            lydict_remove(ctx, type->info.bits.bit[i].ref);
            lys_iffeature_free(ctx, type->info.bits.bit[i].iffeature, type->info.bits.bit[i].iffeature_size);
            lys_extension_instances_free(ctx, type->info.bits.bit[i].ext, type->info.bits.bit[i].ext_size);
        }
        free(type->info.bits.bit);
        break;

    case LY_TYPE_DEC64:
        lys_restr_free(ctx, type->info.dec64.range);
        free(type->info.dec64.range);
        break;

    case LY_TYPE_ENUM:
        for (i = 0; i < type->info.enums.count; i++) {
            lydict_remove(ctx, type->info.enums.enm[i].name);
            lydict_remove(ctx, type->info.enums.enm[i].dsc);
            lydict_remove(ctx, type->info.enums.enm[i].ref);
            lys_iffeature_free(ctx, type->info.enums.enm[i].iffeature, type->info.enums.enm[i].iffeature_size);
            lys_extension_instances_free(ctx, type->info.enums.enm[i].ext, type->info.enums.enm[i].ext_size);
        }
        free(type->info.enums.enm);
        break;

    case LY_TYPE_INT8:
    case LY_TYPE_INT16:
    case LY_TYPE_INT32:
    case LY_TYPE_INT64:
    case LY_TYPE_UINT8:
    case LY_TYPE_UINT16:
    case LY_TYPE_UINT32:
    case LY_TYPE_UINT64:
        lys_restr_free(ctx, type->info.num.range);
        free(type->info.num.range);
        break;

    case LY_TYPE_LEAFREF:
        lydict_remove(ctx, type->info.lref.path);
        break;

    case LY_TYPE_STRING:
        lys_restr_free(ctx, type->info.str.length);
        free(type->info.str.length);
        for (i = 0; i < type->info.str.pat_count; i++) {
            lys_restr_free(ctx, &type->info.str.patterns[i]);
        }
        free(type->info.str.patterns);
        break;

    case LY_TYPE_UNION:
        for (i = 0; i < type->info.uni.count; i++) {
            lys_type_free(ctx, &type->info.uni.types[i]);
        }
        free(type->info.uni.types);
        break;

    case LY_TYPE_IDENT:
        free(type->info.ident.ref);
        break;

    default:
        /* nothing to do for LY_TYPE_INST, LY_TYPE_BOOL, LY_TYPE_EMPTY */
        break;
    }
}